

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

void http1_websocket_client_on_hangup(http_settings_s *settings)

{
  void *ptr;
  
  ptr = settings->udata;
  if (ptr != (void *)0x0) {
    if (*(code **)((long)ptr + 0x20) != (code *)0x0) {
      (**(code **)((long)ptr + 0x20))(0,*(undefined8 *)((long)ptr + 0x28));
      ptr = settings->udata;
    }
    fio_free(ptr);
    settings->udata = (void *)0x0;
  }
  return;
}

Assistant:

static void http1_websocket_client_on_hangup(http_settings_s *settings) {
  websocket_settings_s *s = settings->udata;
  if (s) {
    if (s->on_close)
      s->on_close(0, s->udata);
    fio_free(settings->udata);
    settings->udata = NULL;
  }
}